

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::PropagationVisitor::visit<slang::ast::MinTypMaxExpression>
          (PropagationVisitor *this,MinTypMaxExpression *expr)

{
  not_null<const_slang::ast::Type_*> *this_00;
  bool bVar1;
  bool bVar2;
  Type *rhs;
  Type *pTVar3;
  Expression *pEVar4;
  SourceLocation loc;
  Type *local_38;
  Type *local_30;
  
  bVar1 = bad(&expr->super_Expression);
  if (bVar1) {
    return &expr->super_Expression;
  }
  bVar1 = Type::isError(this->newType);
  if (bVar1) {
    local_38 = this->newType;
    not_null<slang::ast::Type_const*>::not_null<slang::ast::Type_const*,void>
              ((not_null<slang::ast::Type_const*> *)&local_30,&local_38);
    (expr->super_Expression).type.ptr = local_30;
    return &expr->super_Expression;
  }
  pTVar3 = this->newType;
  this_00 = &(expr->super_Expression).type;
  rhs = not_null<const_slang::ast::Type_*>::get(this_00);
  bVar1 = Type::isEquivalent(pTVar3,rhs);
  bVar2 = Type::isFloating(this->newType);
  if (bVar2) {
    pTVar3 = not_null<const_slang::ast::Type_*>::get(this_00);
    bVar2 = Type::isFloating(pTVar3);
    if (!bVar2) goto LAB_0021e0b8;
  }
  else {
LAB_0021e0b8:
    bVar2 = Type::isIntegral(this->newType);
    if (bVar2) {
      pTVar3 = not_null<const_slang::ast::Type_*>::get(this_00);
      bVar2 = Type::isIntegral(pTVar3);
      if (bVar2) goto LAB_0021e108;
    }
    bVar2 = Type::isString(this->newType);
    if ((!bVar2) && ((expr->super_Expression).kind != OpenRange)) {
      if (bVar1) {
        return &expr->super_Expression;
      }
      goto LAB_0021e0f0;
    }
  }
LAB_0021e108:
  bVar2 = MinTypMaxExpression::propagateType(expr,this->context,this->newType);
  if (bVar1 || bVar2) {
    return &expr->super_Expression;
  }
LAB_0021e0f0:
  loc = this->assignmentLoc;
  bVar1 = ((ulong)loc & 0xfffffff) == 0;
  if (bVar1) {
    loc = (expr->super_Expression).sourceRange.startLoc;
  }
  pEVar4 = ConversionExpression::makeImplicit
                     (this->context,this->newType,(uint)bVar1,&expr->super_Expression,loc);
  return pEVar4;
}

Assistant:

Expression& visit(T& expr) {
        if (expr.bad())
            return expr;

        if (newType.isError()) {
            expr.type = &newType;
            return expr;
        }

        // If the new type is equivalent to the old type, there's no need for a
        // conversion. Otherwise if both types are integral or both are real, we have to
        // check if the conversion should be pushed further down the tree. Otherwise we
        // should insert the implicit conversion here.
        bool needConversion = !newType.isEquivalent(*expr.type);
        if constexpr (is_detected_v<propagate_t, T, const ASTContext&, const Type&>) {
            if ((newType.isFloating() && expr.type->isFloating()) ||
                (newType.isIntegral() && expr.type->isIntegral()) || newType.isString() ||
                expr.kind == ExpressionKind::OpenRange) {

                if (expr.propagateType(context, newType))
                    needConversion = false;
            }
        }

        Expression* result = &expr;
        if (needConversion) {
            if (assignmentLoc) {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Implicit, expr,
                                                             assignmentLoc);
            }
            else {
                result = &ConversionExpression::makeImplicit(context, newType,
                                                             ConversionKind::Propagated, expr,
                                                             expr.sourceRange.start());
            }
        }

        return *result;
    }